

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O2

void msd_CE5(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  size_t sVar2;
  uint16_t uVar3;
  size_t i_1;
  long *__ptr;
  long lVar4;
  size_t i;
  size_t sVar5;
  size_t i_3;
  long lVar6;
  
  if (n < 0x10000) {
    msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
    return;
  }
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    uVar3 = get_char<unsigned_short>(strings[sVar5],depth);
    oracle[sVar5] = uVar3;
  }
  __ptr = (long *)calloc(0x10000,8);
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    __ptr[oracle[sVar5]] = __ptr[oracle[sVar5]] + 1;
  }
  msd_CE5::bucketindex[0] = 0;
  sVar5 = 0;
  for (lVar4 = 0; lVar4 != 0xffff; lVar4 = lVar4 + 1) {
    sVar5 = sVar5 + __ptr[lVar4];
    msd_CE5::bucketindex[lVar4 + 1] = sVar5;
  }
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    puVar1 = strings[sVar5];
    sVar2 = msd_CE5::bucketindex[oracle[sVar5]];
    msd_CE5::bucketindex[oracle[sVar5]] = sVar2 + 1;
    sorted[sVar2] = puVar1;
  }
  memcpy(strings,sorted,n << 3);
  lVar4 = *__ptr;
  for (lVar6 = 1; lVar6 != 0x10000; lVar6 = lVar6 + 1) {
    sVar5 = __ptr[lVar6];
    if (sVar5 != 0) {
      if ((char)lVar6 != '\0') {
        msd_CE5(strings + lVar4,sVar5,depth + 2,oracle,sorted);
      }
      lVar4 = lVar4 + sVar5;
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void
msd_CE5(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth,
			(unsigned char*)oracle, sorted);
		return;
	}
	for (size_t i=0; i < n; ++i)
		oracle[i] = get_char<uint16_t>(strings[i], depth);
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE5(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}